

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_key_exchange(ptls_key_exchange_algorithm_t *client,ptls_key_exchange_algorithm_t *server)

{
  code *pcVar1;
  int iVar2;
  ptls_iovec_t pVar3;
  uint8_t *local_78;
  size_t local_70;
  undefined1 auStack_50 [4];
  int ret;
  ptls_iovec_t server_secret;
  ptls_iovec_t server_pubkey;
  ptls_iovec_t client_secret;
  ptls_key_exchange_context_t *ctx;
  ptls_key_exchange_algorithm_t *server_local;
  ptls_key_exchange_algorithm_t *client_local;
  
  iVar2 = (*server->exchange)(server,(ptls_iovec_t *)&server_secret.len,(ptls_iovec_t *)auStack_50,
                              (ptls_iovec_t)ZEXT816(0));
  _ok((uint)(iVar2 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x633)
  ;
  iVar2 = (*client->create)(client,(ptls_key_exchange_context_t **)&client_secret.len);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x637)
  ;
  iVar2 = (*server->exchange)(server,(ptls_iovec_t *)&server_secret.len,(ptls_iovec_t *)auStack_50,
                              *(ptls_iovec_t *)(client_secret.len + 8));
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x639)
  ;
  iVar2 = (**(code **)(client_secret.len + 0x18))
                    (&client_secret.len,1,&server_pubkey.len,server_secret.len,server_pubkey.base);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x63b)
  ;
  _ok((uint)(client_secret.base == server_secret.base),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x63c)
  ;
  iVar2 = memcmp((void *)server_pubkey.len,_auStack_50,(size_t)client_secret.base);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x63d)
  ;
  free((void *)server_pubkey.len);
  free((void *)server_secret.len);
  free(_auStack_50);
  iVar2 = (*client->create)(client,(ptls_key_exchange_context_t **)&client_secret.len);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x645)
  ;
  pcVar1 = *(code **)(client_secret.len + 0x18);
  pVar3 = ptls_iovec_init((void *)0x0,0);
  local_78 = pVar3.base;
  local_70 = pVar3.len;
  iVar2 = (*pcVar1)(&client_secret.len,1,0,local_78,local_70);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x647)
  ;
  _ok((uint)(client_secret.len == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x648)
  ;
  return;
}

Assistant:

void test_key_exchange(ptls_key_exchange_algorithm_t *client, ptls_key_exchange_algorithm_t *server)
{
    ptls_key_exchange_context_t *ctx;
    ptls_iovec_t client_secret, server_pubkey, server_secret;
    int ret;

    /* fail */
    ret = server->exchange(server, &server_pubkey, &server_secret, (ptls_iovec_t){NULL});
    ok(ret != 0);

    /* perform ecdh */
    ret = client->create(client, &ctx);
    ok(ret == 0);
    ret = server->exchange(server, &server_pubkey, &server_secret, ctx->pubkey);
    ok(ret == 0);
    ret = ctx->on_exchange(&ctx, 1, &client_secret, server_pubkey);
    ok(ret == 0);
    ok(client_secret.len == server_secret.len);
    ok(memcmp(client_secret.base, server_secret.base, client_secret.len) == 0);

    free(client_secret.base);
    free(server_pubkey.base);
    free(server_secret.base);

    /* client abort */
    ret = client->create(client, &ctx);
    ok(ret == 0);
    ret = ctx->on_exchange(&ctx, 1, NULL, ptls_iovec_init(NULL, 0));
    ok(ret == 0);
    ok(ctx == NULL);
}